

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O3

void Dch_AddClausesSuper(Dch_Man_t *p,Aig_Obj_t *pNode,Vec_Ptr_t *vSuper)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  uint *begin;
  Dch_Pars_t *pDVar4;
  ulong uVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                  ,0xa8,"void Dch_AddClausesSuper(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if ((*(uint *)&pNode->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                  ,0xa9,"void Dch_AddClausesSuper(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  lVar8 = (long)vSuper->nSize;
  begin = (uint *)malloc(lVar8 * 4 + 4);
  if (0 < lVar8) {
    lVar7 = 0;
    do {
      uVar5 = (ulong)vSuper->pArray[lVar7] & 0xfffffffffffffffe;
      piVar6 = p->pSatVars;
      uVar1 = ((uint)vSuper->pArray[lVar7] & 1) + piVar6[*(int *)(uVar5 + 0x24)] * 2;
      *begin = uVar1;
      iVar3 = piVar6[pNode->Id];
      begin[1] = iVar3 * 2 + 1;
      if (p->pPars->fPolarFlip != 0) {
        if ((*(byte *)(uVar5 + 0x18) & 8) != 0) {
          *begin = uVar1 ^ 1;
        }
        if ((pNode->field_0x18 & 8) != 0) {
          begin[1] = iVar3 * 2;
        }
      }
      iVar3 = sat_solver_addclause(p->pSat,(lit *)begin,(lit *)(begin + 2));
      if (iVar3 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                      ,0xb9,"void Dch_AddClausesSuper(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      lVar7 = lVar7 + 1;
      iVar3 = vSuper->nSize;
    } while (lVar7 < iVar3);
    if (0 < iVar3) {
      ppvVar2 = vSuper->pArray;
      pDVar4 = p->pPars;
      piVar6 = p->pSatVars;
      lVar7 = 0;
      do {
        uVar5 = (ulong)ppvVar2[lVar7] & 0xfffffffffffffffe;
        uVar1 = ((uint)ppvVar2[lVar7] & 1) + piVar6[*(int *)(uVar5 + 0x24)] * 2;
        begin[lVar7] = uVar1 ^ 1;
        if ((pDVar4->fPolarFlip != 0) && ((*(byte *)(uVar5 + 0x18) & 8) != 0)) {
          begin[lVar7] = uVar1;
        }
        lVar7 = lVar7 + 1;
      } while (iVar3 != lVar7);
      goto LAB_005eb472;
    }
  }
  pDVar4 = p->pPars;
  piVar6 = p->pSatVars;
LAB_005eb472:
  iVar3 = piVar6[pNode->Id];
  begin[lVar8] = iVar3 * 2;
  if ((pDVar4->fPolarFlip != 0) && ((pNode->field_0x18 & 8) != 0)) {
    begin[lVar8] = iVar3 * 2 | 1;
  }
  iVar3 = sat_solver_addclause(p->pSat,(lit *)begin,(lit *)(begin + lVar8 + 1));
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                  ,0xca,"void Dch_AddClausesSuper(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  free(begin);
  return;
}

Assistant:

void Dch_AddClausesSuper( Dch_Man_t * p, Aig_Obj_t * pNode, Vec_Ptr_t * vSuper )
{
    Aig_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsNode( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = toLitCond(Dch_ObjSatNum(p,Aig_Regular(pFanin)), Aig_IsComplement(pFanin));
        pLits[1] = toLitCond(Dch_ObjSatNum(p,pNode), 1);
        if ( p->pPars->fPolarFlip )
        {
            if ( Aig_Regular(pFanin)->fPhase )  pLits[0] = lit_neg( pLits[0] );
            if ( pNode->fPhase )                pLits[1] = lit_neg( pLits[1] );
        }
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        pLits[i] = toLitCond(Dch_ObjSatNum(p,Aig_Regular(pFanin)), !Aig_IsComplement(pFanin));
        if ( p->pPars->fPolarFlip )
        {
            if ( Aig_Regular(pFanin)->fPhase )  pLits[i] = lit_neg( pLits[i] );
        }
    }
    pLits[nLits-1] = toLitCond(Dch_ObjSatNum(p,pNode), 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNode->fPhase )  pLits[nLits-1] = lit_neg( pLits[nLits-1] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}